

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::timestamp_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCastTZ>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  ValidityMask *result_mask;
  idx_t iVar3;
  idx_t in_RCX;
  string_t *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint uVar4;
  string_t sVar5;
  timestamp_t *ldata_3;
  string_t *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  timestamp_t *ldata_2;
  string_t *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  timestamp_t *ldata_1;
  string_t *result_data_1;
  timestamp_t *ldata;
  string_t *result_data;
  Vector *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  SelectionVector *in_stack_fffffffffffffe58;
  timestamp_t in_stack_fffffffffffffe60;
  Vector *in_stack_fffffffffffffe68;
  Vector *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffe80;
  optional_idx *in_stack_fffffffffffffe90;
  ValidityMask *in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  SelectionVector *in_stack_fffffffffffffea8;
  idx_t in_stack_fffffffffffffeb0;
  string_t *in_stack_fffffffffffffeb8;
  timestamp_t *in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffed0;
  string_t *psVar6;
  undefined1 uVar7;
  void *in_stack_fffffffffffffed8;
  ValidityMask *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  UnifiedVectorFormat *in_stack_ffffffffffffff10;
  idx_t in_stack_ffffffffffffff18;
  Vector *in_stack_ffffffffffffff20;
  UnifiedVectorFormat local_d0;
  SelectionVector *local_88;
  timestamp_t *local_80;
  string_t *local_78;
  Vector *local_70;
  optional_idx local_68;
  timestamp_t *local_60;
  string_t *local_58;
  int64_t local_50;
  undefined8 local_48;
  char *local_40;
  timestamp_t *local_38;
  string_t *local_30;
  char local_22;
  byte local_21;
  string_t *local_18;
  Vector *local_10;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe80,vector_type_p);
    local_58 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1192e25);
    local_60 = FlatVector::GetData<duckdb::timestamp_t>((Vector *)0x1192e3a);
    psVar6 = local_58;
    result_mask = FlatVector::Validity((Vector *)0x1192e7f);
    uVar7 = (undefined1)((ulong)psVar6 >> 0x38);
    FlatVector::Validity((Vector *)0x1192e94);
    ExecuteFlat<duckdb::timestamp_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCastTZ>>
              ((timestamp_t *)in_RSI,in_RDX,in_RCX,
               (ValidityMask *)CONCAT44(in_R8D,in_stack_fffffffffffffee8),result_mask,local_18,
               (bool)uVar7);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe80,vector_type_p);
    uVar7 = (undefined1)((ulong)in_stack_fffffffffffffe98 >> 0x38);
    local_30 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x1192d46);
    local_38 = ConstantVector::GetData<duckdb::timestamp_t>((Vector *)0x1192d5b);
    bVar2 = ConstantVector::IsNull((Vector *)0x1192d70);
    if (bVar2) {
      ConstantVector::SetNull(in_stack_fffffffffffffea0,(bool)uVar7);
    }
    else {
      ConstantVector::SetNull(in_stack_fffffffffffffea0,(bool)uVar7);
      local_50 = local_38->value;
      ConstantVector::Validity(local_10);
      sVar5 = GenericUnaryWrapper::
              Operation<duckdb::VectorStringCastOperator<duckdb::StringCastTZ>,duckdb::timestamp_t,duckdb::string_t>
                        (in_stack_fffffffffffffe60,(ValidityMask *)in_stack_fffffffffffffe58,
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
      local_48 = sVar5.value._0_8_;
      *(undefined8 *)&local_30->value = local_48;
      local_40 = sVar5.value._8_8_;
      (local_30->value).pointer.ptr = local_40;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_68 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe48);
      bVar2 = optional_idx::IsValid(&local_68);
      if ((bVar2) &&
         (iVar3 = optional_idx::GetIndex(in_stack_fffffffffffffe90),
         (string_t *)(iVar3 * 2) < local_18 || (long)(iVar3 * 2) - (long)local_18 == 0)) {
        local_70 = DictionaryVector::Child((Vector *)0x1192f3c);
        VVar1 = Vector::GetVectorType(local_70);
        if (VVar1 == FLAT_VECTOR) {
          local_78 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1192f66);
          uVar7 = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
          local_80 = FlatVector::GetData<duckdb::timestamp_t>((Vector *)0x1192f7b);
          optional_idx::GetIndex(in_stack_fffffffffffffe90);
          FlatVector::Validity((Vector *)0x1192fbc);
          FlatVector::Validity((Vector *)0x1192fce);
          ExecuteFlat<duckdb::timestamp_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCastTZ>>
                    ((timestamp_t *)in_RSI,in_RDX,in_RCX,
                     (ValidityMask *)CONCAT44(in_R8D,in_stack_fffffffffffffee8),
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(bool)uVar7);
          local_88 = DictionaryVector::SelVector((Vector *)0x119300e);
          optional_idx::GetIndex(in_stack_fffffffffffffe90);
          Vector::Dictionary(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             in_stack_fffffffffffffe60.value,in_stack_fffffffffffffe58,
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          return;
        }
      }
    }
    uVar7 = (undefined1)((ulong)&local_d0 >> 0x38);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe60.value)
    ;
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    Vector::SetVectorType(in_stack_fffffffffffffe80,vector_type_p);
    FlatVector::GetData<duckdb::string_t>((Vector *)0x11930b6);
    UnifiedVectorFormat::GetData<duckdb::timestamp_t>(&local_d0);
    FlatVector::Validity((Vector *)0x119312d);
    uVar4 = local_21 & 1;
    ExecuteLoop<duckdb::timestamp_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCastTZ>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,(ValidityMask *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffed0,(bool)uVar7);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}